

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O0

void highbd_transpose8x8_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *x4,__m128i *x5,__m128i *x6,
               __m128i *x7,__m128i *d0,__m128i *d1,__m128i *d2,__m128i *d3,__m128i *d4,__m128i *d5,
               __m128i *d6,__m128i *d7)

{
  __m128i *in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  __m128i *in_RDI;
  __m128i *in_R8;
  __m128i *in_R9;
  __m128i *in_stack_00000008;
  __m128i *in_stack_00000010;
  __m128i *in_stack_00000018;
  __m128i *in_stack_00000020;
  __m128i *in_stack_00000028;
  
  highbd_transpose8x8_low_sse2
            (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,in_stack_00000010,
             in_stack_00000018,in_stack_00000020,in_stack_00000028,x5);
  highbd_transpose8x8_high_sse2
            (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,in_stack_00000010,x4,x3,x2,x1
            );
  return;
}

Assistant:

static inline void highbd_transpose8x8_sse2(
    __m128i *x0, __m128i *x1, __m128i *x2, __m128i *x3, __m128i *x4,
    __m128i *x5, __m128i *x6, __m128i *x7, __m128i *d0, __m128i *d1,
    __m128i *d2, __m128i *d3, __m128i *d4, __m128i *d5, __m128i *d6,
    __m128i *d7) {
  highbd_transpose8x8_low_sse2(x0, x1, x2, x3, x4, x5, x6, x7, d0, d1, d2, d3);
  highbd_transpose8x8_high_sse2(x0, x1, x2, x3, x4, x5, x6, x7, d4, d5, d6, d7);
}